

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit.cpp
# Opt level: O0

QAction * __thiscall QLineEdit::addAction(QLineEdit *this,QIcon *icon,ActionPosition position)

{
  QAction *this_00;
  QIcon *in_RSI;
  QObject *in_RDI;
  long in_FS_OFFSET;
  QAction *result;
  QString *pQVar1;
  ActionPosition position_00;
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QAction *)operator_new(0x10);
  pQVar1 = (QString *)local_20;
  QString::QString((QString *)0x5c3bc5);
  QAction::QAction(this_00,in_RSI,pQVar1,in_RDI);
  position_00 = (ActionPosition)((ulong)pQVar1 >> 0x20);
  QString::~QString((QString *)0x5c3be7);
  addAction((QLineEdit *)in_RDI,this_00,position_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return this_00;
  }
  __stack_chk_fail();
}

Assistant:

QAction *QLineEdit::addAction(const QIcon &icon, ActionPosition position)
{
    QAction *result = new QAction(icon, QString(), this);
    addAction(result, position);
    return result;
}